

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccm.c
# Opt level: O0

int ccm_auth_crypt(mbedtls_ccm_context *ctx,int mode,size_t length,uchar *iv,size_t iv_len,
                  uchar *add,size_t add_len,uchar *input,uchar *output,uchar *tag,size_t tag_len)

{
  uchar uVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  uchar auStack_178 [184];
  ulong local_c0;
  size_t local_b8;
  size_t local_b0;
  size_t use_len_1;
  size_t use_len;
  uchar *dst;
  uchar *src;
  uchar ctr [16];
  uchar y [16];
  uchar b [16];
  size_t olen;
  size_t len_left;
  uchar q;
  uchar i;
  int ret;
  uchar *add_local;
  size_t iv_len_local;
  uchar *iv_local;
  size_t length_local;
  int mode_local;
  mbedtls_ccm_context *ctx_local;
  
  if (((tag_len == 2) || (0x10 < tag_len)) || ((tag_len & 1) != 0)) {
    ctx_local._4_4_ = -0xd;
  }
  else if ((iv_len < 7) || (0xd < iv_len)) {
    ctx_local._4_4_ = -0xd;
  }
  else if (add_len < 0xff01) {
    cVar2 = -(char)iv_len;
    bVar3 = cVar2 + 0xf;
    y[8] = (add_len != 0) << 6 | (byte)((tag_len - 2 >> 1) << 3) | cVar2 + 0xeU;
    memcpy(y + 9,iv,iv_len);
    olen = length;
    for (len_left._3_1_ = 0; len_left._3_1_ < bVar3; len_left._3_1_ = len_left._3_1_ + 1) {
      y[(long)(int)(0xf - (uint)len_left._3_1_) + 8] = (uchar)olen;
      olen = olen >> 8;
    }
    if (olen == 0) {
      memset(ctr + 8,0,0x10);
      for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
        ctr[(ulong)len_left._3_1_ + 8] =
             ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
      }
      ctx_local._4_4_ =
           mbedtls_cipher_update(&ctx->cipher_ctx,ctr + 8,0x10,ctr + 8,(size_t *)(b + 8));
      if (ctx_local._4_4_ == 0) {
        if (add_len != 0) {
          memset(y + 8,0,0x10);
          y[8] = (uchar)(add_len >> 8);
          y[9] = (uchar)add_len;
          if (add_len < 0xe) {
            local_b0 = add_len;
          }
          else {
            local_b0 = 0xe;
          }
          memcpy(y + 10,add,local_b0);
          olen = add_len - local_b0;
          dst = add + local_b0;
          for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
            ctr[(ulong)len_left._3_1_ + 8] =
                 ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
          }
          iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,ctr + 8,0x10,ctr + 8,(size_t *)(b + 8));
          if (iVar4 != 0) {
            return iVar4;
          }
          for (; olen != 0; olen = olen - local_b8) {
            if (olen < 0x11) {
              local_b8 = olen;
            }
            else {
              local_b8 = 0x10;
            }
            memset(y + 8,0,0x10);
            memcpy(y + 8,dst,local_b8);
            for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
              ctr[(ulong)len_left._3_1_ + 8] =
                   ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
            }
            iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,ctr + 8,0x10,ctr + 8,(size_t *)(b + 8));
            if (iVar4 != 0) {
              return iVar4;
            }
            dst = dst + local_b8;
          }
        }
        src._0_1_ = cVar2 + '\x0e';
        memcpy((void *)((long)&src + 1),iv,iv_len);
        memset(ctr + (iv_len - 7),0,(ulong)bVar3);
        ctr[7] = '\x01';
        dst = input;
        use_len = (size_t)output;
        olen = length;
        while (olen != 0) {
          if (olen < 0x11) {
            local_c0 = olen;
          }
          else {
            local_c0 = 0x10;
          }
          if (mode == 0) {
            memset(y + 8,0,0x10);
            memcpy(y + 8,dst,local_c0);
            for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
              ctr[(ulong)len_left._3_1_ + 8] =
                   ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
            }
            iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,ctr + 8,0x10,ctr + 8,(size_t *)(b + 8));
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,(uchar *)&src,0x10,y + 8,(size_t *)(b + 8))
          ;
          if (iVar4 != 0) {
            return iVar4;
          }
          for (len_left._3_1_ = 0; len_left._3_1_ < local_c0; len_left._3_1_ = len_left._3_1_ + 1) {
            *(uchar *)(use_len + len_left._3_1_) =
                 dst[len_left._3_1_] ^ y[(ulong)len_left._3_1_ + 8];
          }
          if (mode == 1) {
            memset(y + 8,0,0x10);
            memcpy(y + 8,(void *)use_len,local_c0);
            for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
              ctr[(ulong)len_left._3_1_ + 8] =
                   ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
            }
            iVar4 = mbedtls_cipher_update(&ctx->cipher_ctx,ctr + 8,0x10,ctr + 8,(size_t *)(b + 8));
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          use_len = local_c0 + use_len;
          dst = dst + local_c0;
          olen = olen - local_c0;
          len_left._3_1_ = 0;
          while ((len_left._3_1_ < bVar3 &&
                 (uVar1 = ctr[(long)(int)(0xf - (uint)len_left._3_1_) + -8],
                 ctr[(long)(int)(0xf - (uint)len_left._3_1_) + -8] = uVar1 + '\x01',
                 (uchar)(uVar1 + '\x01') == '\0'))) {
            len_left._3_1_ = len_left._3_1_ + 1;
          }
        }
        for (len_left._3_1_ = 0; len_left._3_1_ < bVar3; len_left._3_1_ = len_left._3_1_ + 1) {
          ctr[(long)(int)(0xf - (uint)len_left._3_1_) + -8] = '\0';
        }
        ctx_local._4_4_ =
             mbedtls_cipher_update(&ctx->cipher_ctx,(uchar *)&src,0x10,y + 8,(size_t *)(b + 8));
        if (ctx_local._4_4_ == 0) {
          for (len_left._3_1_ = 0; len_left._3_1_ < 0x10; len_left._3_1_ = len_left._3_1_ + 1) {
            ctr[(ulong)len_left._3_1_ + 8] =
                 ctr[(ulong)len_left._3_1_ + 8] ^ y[(ulong)len_left._3_1_ + 8];
          }
          memcpy(tag,ctr + 8,tag_len);
          ctx_local._4_4_ = 0;
        }
      }
    }
    else {
      ctx_local._4_4_ = -0xd;
    }
  }
  else {
    ctx_local._4_4_ = -0xd;
  }
  return ctx_local._4_4_;
}

Assistant:

static int ccm_auth_crypt( mbedtls_ccm_context *ctx, int mode, size_t length,
                           const unsigned char *iv, size_t iv_len,
                           const unsigned char *add, size_t add_len,
                           const unsigned char *input, unsigned char *output,
                           unsigned char *tag, size_t tag_len )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char i;
    unsigned char q;
    size_t len_left, olen;
    unsigned char b[16];
    unsigned char y[16];
    unsigned char ctr[16];
    const unsigned char *src;
    unsigned char *dst;

    /*
     * Check length requirements: SP800-38C A.1
     * Additional requirement: a < 2^16 - 2^8 to simplify the code.
     * 'length' checked later (when writing it to the first block)
     *
     * Also, loosen the requirements to enable support for CCM* (IEEE 802.15.4).
     */
    if( tag_len == 2 || tag_len > 16 || tag_len % 2 != 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    /* Also implies q is within bounds */
    if( iv_len < 7 || iv_len > 13 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    if( add_len > 0xFF00 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );

    q = 16 - 1 - (unsigned char) iv_len;

    /*
     * First block B_0:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       length
     *
     * With flags as (bits):
     * 7        0
     * 6        add present?
     * 5 .. 3   (t - 2) / 2
     * 2 .. 0   q - 1
     */
    b[0] = 0;
    b[0] |= ( add_len > 0 ) << 6;
    b[0] |= ( ( tag_len - 2 ) / 2 ) << 3;
    b[0] |= q - 1;

    memcpy( b + 1, iv, iv_len );

    for( i = 0, len_left = length; i < q; i++, len_left >>= 8 )
        b[15-i] = (unsigned char)( len_left & 0xFF );

    if( len_left > 0 )
        return( MBEDTLS_ERR_CCM_BAD_INPUT );


    /* Start CBC-MAC with first block */
    memset( y, 0, 16 );
    UPDATE_CBC_MAC;

    /*
     * If there is additional data, update CBC-MAC with
     * add_len, add, 0 (padding to a block boundary)
     */
    if( add_len > 0 )
    {
        size_t use_len;
        len_left = add_len;
        src = add;

        memset( b, 0, 16 );
        b[0] = (unsigned char)( ( add_len >> 8 ) & 0xFF );
        b[1] = (unsigned char)( ( add_len      ) & 0xFF );

        use_len = len_left < 16 - 2 ? len_left : 16 - 2;
        memcpy( b + 2, src, use_len );
        len_left -= use_len;
        src += use_len;

        UPDATE_CBC_MAC;

        while( len_left > 0 )
        {
            use_len = len_left > 16 ? 16 : len_left;

            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;

            len_left -= use_len;
            src += use_len;
        }
    }

    /*
     * Prepare counter block for encryption:
     * 0        .. 0        flags
     * 1        .. iv_len   nonce (aka iv)
     * iv_len+1 .. 15       counter (initially 1)
     *
     * With flags as (bits):
     * 7 .. 3   0
     * 2 .. 0   q - 1
     */
    ctr[0] = q - 1;
    memcpy( ctr + 1, iv, iv_len );
    memset( ctr + 1 + iv_len, 0, q );
    ctr[15] = 1;

    /*
     * Authenticate and {en,de}crypt the message.
     *
     * The only difference between encryption and decryption is
     * the respective order of authentication and {en,de}cryption.
     */
    len_left = length;
    src = input;
    dst = output;

    while( len_left > 0 )
    {
        size_t use_len = len_left > 16 ? 16 : len_left;

        if( mode == CCM_ENCRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, src, use_len );
            UPDATE_CBC_MAC;
        }

        CTR_CRYPT( dst, src, use_len );

        if( mode == CCM_DECRYPT )
        {
            memset( b, 0, 16 );
            memcpy( b, dst, use_len );
            UPDATE_CBC_MAC;
        }

        dst += use_len;
        src += use_len;
        len_left -= use_len;

        /*
         * Increment counter.
         * No need to check for overflow thanks to the length check above.
         */
        for( i = 0; i < q; i++ )
            if( ++ctr[15-i] != 0 )
                break;
    }

    /*
     * Authentication: reset counter and crypt/mask internal tag
     */
    for( i = 0; i < q; i++ )
        ctr[15-i] = 0;

    CTR_CRYPT( y, y, 16 );
    memcpy( tag, y, tag_len );

    return( 0 );
}